

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::ctx::ctx(ctx *this,env *environment_,text *proposition_)

{
  env *this_00;
  string local_40 [32];
  text *local_20;
  text *proposition__local;
  env *environment__local;
  ctx *this_local;
  
  this->environment = environment_;
  this->once = true;
  this_00 = this->environment;
  local_20 = proposition_;
  proposition__local = (text *)environment_;
  environment__local = (env *)this;
  std::__cxx11::string::string(local_40,(string *)proposition_);
  env::push(this_00,(text *)local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

ctx( env & environment_, text proposition_ )
    : environment( environment_), once( true )
    {
        environment.push( proposition_);
    }